

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Sat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  Vec_Int_t *local_88;
  Vec_Int_t *vStatuses;
  Vec_Str_t *vStatus;
  Vec_Int_t *vCounters;
  uint local_68;
  int fCSat;
  int fNewSolver;
  int c;
  Gia_Man_t *pTemp;
  Cec_ParSat_t *pPars;
  Cec_ParSat_t ParsSat;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pTemp = (Gia_Man_t *)((long)&pPars + 4);
  local_68 = 0;
  vCounters._4_4_ = 0;
  ParsSat._28_8_ = argv;
  Cec_ManSatSetDefaultParams((Cec_ParSat_t *)pTemp);
  Extra_UtilGetoptReset();
LAB_002a9cbc:
  do {
    fCSat = Extra_UtilGetopt(argc,(char **)ParsSat._28_8_,"CSNanmtcxvh");
    if (fCSat == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Sat(): There is no AIG.\n");
        return 1;
      }
      if (vCounters._4_4_ == 0) {
        _fNewSolver = Cec_ManSatSolving(pAbc->pGia,(Cec_ParSat_t *)pTemp);
        Abc_FrameUpdateGia(pAbc,_fNewSolver);
      }
      else {
        if (local_68 == 0) {
          if (pTemp->nObjs == 0) {
            if (*(int *)((long)&pTemp->pSpec + 4) == 0) {
              vStatus = (Vec_Str_t *)
                        Cbs_ManSolveMiter(pAbc->pGia,*(int *)&pTemp->pName,(Vec_Str_t **)&vStatuses,
                                          *(int *)&pTemp->pObjs);
            }
            else {
              vStatus = (Vec_Str_t *)
                        Cbs_ManSolveMiterNc(pAbc->pGia,*(int *)&pTemp->pName,
                                            (Vec_Str_t **)&vStatuses,*(int *)&pTemp->pObjs);
            }
          }
          else {
            vStatus = (Vec_Str_t *)
                      Tas_ManSolveMiterNc(pAbc->pGia,*(int *)&pTemp->pName,(Vec_Str_t **)&vStatuses,
                                          *(int *)&pTemp->pObjs);
          }
        }
        else {
          vStatus = (Vec_Str_t *)
                    Cbs2_ManSolveMiterNc
                              (pAbc->pGia,*(int *)&pTemp->pName,(Vec_Str_t **)&vStatuses,
                               *(int *)&pTemp->pObjs);
        }
        Vec_IntFree((Vec_Int_t *)vStatus);
        Vec_StrFree((Vec_Str_t *)vStatuses);
      }
      if (pAbc->pGia->vSeqModelVec != (Vec_Ptr_t *)0x0) {
        local_88 = Abc_FrameDeriveStatusArray2(pAbc->pGia->vSeqModelVec);
        Abc_FrameReplacePoStatuses(pAbc,&local_88);
        Abc_FrameReplaceCexVec(pAbc,&pAbc->pGia->vSeqModelVec);
      }
      return 0;
    }
    switch(fCSat) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002aa04c;
      }
      iVar1 = atoi(*(char **)(ParsSat._28_8_ + (long)globalUtilOptind * 8));
      *(int *)&pTemp->pName = iVar1;
      iVar1 = *(int *)&pTemp->pName;
      break;
    default:
      goto LAB_002aa04c;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_002aa04c;
      }
      iVar1 = atoi(*(char **)(ParsSat._28_8_ + (long)globalUtilOptind * 8));
      *(int *)&pTemp->pSpec = iVar1;
      iVar1 = *(int *)&pTemp->pSpec;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_002aa04c;
      }
      iVar1 = atoi(*(char **)(ParsSat._28_8_ + (long)globalUtilOptind * 8));
      *(int *)((long)&pTemp->pName + 4) = iVar1;
      iVar1 = *(int *)((long)&pTemp->pName + 4);
      break;
    case 0x61:
      pTemp->nObjsAlloc = pTemp->nObjsAlloc ^ 1;
      goto LAB_002a9cbc;
    case 99:
      vCounters._4_4_ = vCounters._4_4_ ^ 1;
      goto LAB_002a9cbc;
    case 0x6d:
      pTemp->nRegsAlloc = pTemp->nRegsAlloc ^ 1;
      goto LAB_002a9cbc;
    case 0x6e:
      *(uint *)((long)&pTemp->pSpec + 4) = *(uint *)((long)&pTemp->pSpec + 4) ^ 1;
      goto LAB_002a9cbc;
    case 0x74:
      pTemp->nObjs = pTemp->nObjs ^ 1;
      goto LAB_002a9cbc;
    case 0x76:
      *(uint *)&pTemp->pObjs = *(uint *)&pTemp->pObjs ^ 1;
      goto LAB_002a9cbc;
    case 0x78:
      local_68 = local_68 ^ 1;
      goto LAB_002a9cbc;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_002aa04c:
      Abc_Print(-2,"usage: &sat [-CSN <num>] [-anmctxvh]\n");
      Abc_Print(-2,"\t         performs SAT solving for the combinational outputs\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)*(uint *)&pTemp->pName);
      Abc_Print(-2,"\t-S num : the min number of variables to recycle the solver [default = %d]\n",
                (ulong)*(uint *)((long)&pTemp->pName + 4));
      Abc_Print(-2,"\t-N num : the min number of calls to recycle the solver [default = %d]\n",
                (ulong)*(uint *)&pTemp->pSpec);
      pcVar2 = "no";
      if (pTemp->nObjsAlloc != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,
                "\t-a     : toggle solving all outputs and saving counter-examples [default = %s]\n"
                ,pcVar2);
      pcVar2 = "no";
      if (*(int *)((long)&pTemp->pSpec + 4) != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-n     : toggle using non-chronological backtracking [default = %s]\n",pcVar2)
      ;
      pcVar2 = "circuit";
      if (pTemp->nRegsAlloc != 0) {
        pcVar2 = "miter";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (vCounters._4_4_ != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle using circuit-based SAT solver [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (pTemp->nObjs != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggle using learning in curcuit-based solver [default = %s]\n",
                pcVar2);
      pcVar2 = "no";
      if (local_68 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-x     : toggle using new solver [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (*(int *)&pTemp->pObjs != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Sat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Int_t * Cbs2_ManSolveMiterNc( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose );
    Cec_ParSat_t ParsSat, * pPars = &ParsSat;
    Gia_Man_t * pTemp;
    int c;
    int fNewSolver = 0, fCSat = 0;
    Cec_ManSatSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CSNanmtcxvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCallsRecycle = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCallsRecycle < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fSaveCexes ^= 1;
            break;
        case 'n':
            pPars->fNonChrono ^= 1;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 't':
            pPars->fLearnCls ^= 1;
            break;
        case 'c':
            fCSat ^= 1;
            break;
        case 'x':
            fNewSolver ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sat(): There is no AIG.\n" );
        return 1;
    }
    if ( fCSat )
    {
        Vec_Int_t * vCounters;
        Vec_Str_t * vStatus;
        if ( fNewSolver )
            vCounters = Cbs2_ManSolveMiterNc( pAbc->pGia, pPars->nBTLimit, &vStatus, pPars->fVerbose );
        else if ( pPars->fLearnCls )
            vCounters = Tas_ManSolveMiterNc( pAbc->pGia, pPars->nBTLimit, &vStatus, pPars->fVerbose );
        else if ( pPars->fNonChrono )
            vCounters = Cbs_ManSolveMiterNc( pAbc->pGia, pPars->nBTLimit, &vStatus, pPars->fVerbose );
        else
            vCounters = Cbs_ManSolveMiter( pAbc->pGia, pPars->nBTLimit, &vStatus, pPars->fVerbose );
        Vec_IntFree( vCounters );
        Vec_StrFree( vStatus );
    }
    else
    {
        pTemp = Cec_ManSatSolving( pAbc->pGia, pPars );
        Abc_FrameUpdateGia( pAbc, pTemp );
    }
    if ( pAbc->pGia->vSeqModelVec )
    {
        Vec_Int_t * vStatuses = Abc_FrameDeriveStatusArray2( pAbc->pGia->vSeqModelVec );
        Abc_FrameReplacePoStatuses( pAbc, &vStatuses );
        Abc_FrameReplaceCexVec( pAbc, &pAbc->pGia->vSeqModelVec );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &sat [-CSN <num>] [-anmctxvh]\n" );
    Abc_Print( -2, "\t         performs SAT solving for the combinational outputs\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the min number of variables to recycle the solver [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-N num : the min number of calls to recycle the solver [default = %d]\n", pPars->nCallsRecycle );
    Abc_Print( -2, "\t-a     : toggle solving all outputs and saving counter-examples [default = %s]\n", pPars->fSaveCexes? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle using non-chronological backtracking [default = %s]\n", pPars->fNonChrono? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-c     : toggle using circuit-based SAT solver [default = %s]\n", fCSat? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle using learning in curcuit-based solver [default = %s]\n", pPars->fLearnCls? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle using new solver [default = %s]\n", fNewSolver? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}